

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta,longdouble obj_amp)

{
  int bkmin;
  row_iterator prVar1;
  longdouble *__return_storage_ptr__;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> prVar2;
  longdouble lVar3;
  bit_array *x_00;
  bool bVar4;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar5;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar6;
  type prVar7;
  pointer begin;
  pointer prVar8;
  type pbVar9;
  type args_1;
  type prVar10;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar11;
  longdouble lVar12;
  bool local_161;
  undefined1 auStack_e8 [7];
  bool pi_change;
  string_view local_d8;
  int local_c4;
  undefined1 auStack_c0 [4];
  int i_1;
  int local_b0;
  int local_ac;
  int selected;
  int i;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_84;
  undefined1 auStack_80 [4];
  int k;
  bool local_69;
  undefined1 auStack_68 [7];
  bool at_least_one_pi_changed;
  longdouble obj_amp_local;
  longdouble theta_local;
  longdouble delta_local;
  longdouble kappa_local;
  bit_array *x_local;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  stack0xffffffffffffffc8 = kappa;
  stack0xffffffffffffffb8 = delta;
  stack0xffffffffffffffa8 = theta;
  _auStack_68 = obj_amp;
  local_69 = false;
  lVar11 = in_ST3;
  lVar12 = in_ST3;
  unique0x100004c8 = x;
  x_local = (bit_array *)this;
  this_local = (solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                *)last._M_current;
  last_local = first;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_80,
             "push-update-row {} {} {}\n");
  debug_logger<false>::log<long_double,long_double,long_double>
            ((debug_logger<false> *)this,_auStack_80,(longdouble *)((long)&delta_local + 8),
             (longdouble *)((long)&theta_local + 8),(longdouble *)((long)&obj_amp_local + 8));
  while( true ) {
    bVar4 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                      (&last_local,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &this_local);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      return (bool)(local_69 & 1);
    }
    local_84 = constraint<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         (last_local);
    if (*(int *)(this + 0x88) <= local_84) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)&sizes,(int)this + 0x10);
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    prVar1 = *pprVar5;
    pprVar6 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
    ::decrease_preference
              ((solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                *)this,prVar1,*pprVar6,stack0xffffffffffffffa8);
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    prVar1 = *pprVar5;
    pprVar6 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    _selected = solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                ::compute_reduced_costs<baryonyx::bit_array>
                          ((solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                            *)this,prVar1,*pprVar6,stack0xffffffffffffffd8);
    for (local_ac = 0; lVar3 = _auStack_68, local_ac != selected; local_ac = local_ac + 1) {
      __return_storage_ptr__ = *(longdouble **)(this + 0x80);
      pprVar5 = std::
                get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                          ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                            *)&sizes);
      prVar2 = *pprVar5;
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x68),(long)local_ac);
      quadratic_cost_type<long_double>::operator()
                (__return_storage_ptr__,
                 (quadratic_cost_type<long_double> *)(ulong)(uint)prVar2[prVar7->id].column,
                 (int)stack0xffffffffffffffd8,(bit_array *)(long)prVar7->id);
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x68),(long)local_ac);
      prVar7->value = prVar7->value + lVar3 * in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar11;
      lVar11 = lVar12;
    }
    begin = std::
            unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                   *)(this + 0x68));
    prVar8 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::get((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                    *)(this + 0x68));
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>
              (begin,prVar8 + selected,*(random_engine **)(this + 8));
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_84);
    bkmin = pbVar9->min;
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_84);
    local_b0 = solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
               ::select_variables((solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                                   *)this,(rc_size *)&selected,bkmin,pbVar9->max);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c0,
               "constraints {}: {} <= ");
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_84);
    debug_logger<false>::log<int,int>
              ((debug_logger<false> *)this,_auStack_c0,&local_84,&pbVar9->min);
    for (local_c4 = 0; local_c4 < selected; local_c4 = local_c4 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d8,"{} ({} {}) ");
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x68),(long)local_c4);
      args_1 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x68),(long)local_c4);
      prVar10 = std::
                unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                              *)(this + 0x68),(long)local_c4);
      debug_logger<false>::log<int,long_double,int>
                ((debug_logger<false> *)this,local_d8,&prVar7->f,&args_1->value,&prVar10->id);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8,
               "<= {} => Selected: {}\n");
    pbVar9 = std::
             unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                           *)(this + 0x70),(long)local_84);
    debug_logger<false>::log<int,int>
              ((debug_logger<false> *)this,_auStack_e8,&pbVar9->max,&local_b0);
    x_00 = stack0xffffffffffffffd8;
    pprVar5 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    bVar4 = affect<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                      ((solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                        *)this,x_00,*pprVar5,local_84,local_b0,selected,stack0xffffffffffffffc8,
                       stack0xffffffffffffffb8);
    local_161 = true;
    if ((local_69 & 1U) == 0) {
      local_161 = bVar4;
    }
    local_69 = local_161;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&last_local);
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-inequalities-101.cpp"
                     ,"266");
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }